

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O3

void Ptex::v2_2::(anonymous_namespace)::ApplyS<unsigned_short,4>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int nTxChan)

{
  ulong *puVar1;
  float fVar2;
  ulong uVar3;
  byte bVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  long lVar15;
  float *pfVar16;
  ulong *puVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  bVar4 = (k->res).ulog2;
  iVar21 = nTxChan << (bVar4 & 0x1f);
  lVar15 = (long)iVar21 * (long)k->vw;
  if ((int)lVar15 != 0) {
    puVar17 = (ulong *)((long)data + (long)(((k->v << (bVar4 & 0x1f)) + k->u) * nTxChan) * 2);
    puVar1 = (ulong *)((long)puVar17 + lVar15 * 2);
    pfVar5 = k->ku;
    pfVar16 = k->kv;
    lVar20 = (long)nTxChan;
    lVar19 = k->uw * lVar20;
    iVar18 = (int)lVar19;
    lVar15 = lVar20 * 2;
    do {
      uVar3 = *puVar17;
      auVar7._8_4_ = 0;
      auVar7._0_8_ = uVar3;
      auVar7._12_2_ = (short)(uVar3 >> 0x30);
      auVar9._8_2_ = (short)(uVar3 >> 0x20);
      auVar9._0_8_ = uVar3;
      auVar9._10_4_ = auVar7._10_4_;
      auVar13._6_8_ = 0;
      auVar13._0_6_ = auVar9._8_6_;
      auVar11._4_2_ = (short)(uVar3 >> 0x10);
      auVar11._0_4_ = (uint)uVar3;
      auVar11._6_8_ = SUB148(auVar13 << 0x40,6);
      fVar26 = *pfVar5;
      fVar23 = fVar26 * (float)((uint)uVar3 & 0xffff);
      fVar24 = fVar26 * (float)auVar11._4_4_;
      fVar25 = fVar26 * (float)auVar9._8_4_;
      fVar26 = fVar26 * (float)(auVar7._10_4_ >> 0x10);
      lVar22 = lVar19 * 2;
      pfVar6 = pfVar5;
      if (iVar18 != nTxChan) {
        do {
          uVar3 = *(ulong *)((long)puVar17 + lVar15);
          puVar17 = (ulong *)((long)puVar17 + lVar15);
          auVar8._8_4_ = 0;
          auVar8._0_8_ = uVar3;
          auVar8._12_2_ = (short)(uVar3 >> 0x30);
          auVar10._8_2_ = (short)(uVar3 >> 0x20);
          auVar10._0_8_ = uVar3;
          auVar10._10_4_ = auVar8._10_4_;
          auVar14._6_8_ = 0;
          auVar14._0_6_ = auVar10._8_6_;
          auVar12._4_2_ = (short)(uVar3 >> 0x10);
          auVar12._0_4_ = (uint)uVar3;
          auVar12._6_8_ = SUB148(auVar14 << 0x40,6);
          fVar2 = pfVar6[1];
          fVar23 = fVar23 + fVar2 * (float)((uint)uVar3 & 0xffff);
          fVar24 = fVar24 + fVar2 * (float)auVar12._4_4_;
          fVar25 = fVar25 + fVar2 * (float)auVar10._8_4_;
          fVar26 = fVar26 + fVar2 * (float)(auVar8._10_4_ >> 0x10);
          lVar22 = lVar22 + lVar20 * -2;
          pfVar6 = pfVar6 + 1;
        } while (lVar15 != lVar22);
      }
      fVar2 = *pfVar16;
      pfVar16 = pfVar16 + 1;
      *result = fVar2 * fVar23 + *result;
      result[1] = fVar2 * fVar24 + result[1];
      result[2] = fVar2 * fVar25 + result[2];
      result[3] = fVar2 * fVar26 + result[3];
      puVar17 = (ulong *)((long)puVar17 + (long)(iVar21 - iVar18) * 2 + lVar20 * 2);
    } while (puVar17 != puVar1);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }